

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmSetPropertyCommand::HandleSource(cmSetPropertyCommand *this,cmSourceFile *sf)

{
  char *pcVar1;
  char *this_00;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  char *local_28;
  char *value;
  char *name;
  cmSourceFile *sf_local;
  cmSetPropertyCommand *this_local;
  
  name = (char *)sf;
  sf_local = (cmSourceFile *)this;
  value = (char *)std::__cxx11::string::c_str();
  local_28 = (char *)std::__cxx11::string::c_str();
  this_00 = name;
  pcVar1 = value;
  if ((this->Remove & 1U) != 0) {
    local_28 = (char *)0x0;
  }
  if ((this->AppendMode & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,pcVar1,&local_81);
    cmSourceFile::SetProperty((cmSourceFile *)this_00,&local_80,local_28);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
    cmSourceFile::AppendProperty
              ((cmSourceFile *)this_00,&local_48,local_28,(bool)(this->AppendAsString & 1));
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return true;
}

Assistant:

bool cmSetPropertyCommand::HandleSource(cmSourceFile* sf)
{
  // Set or append the property.
  const char* name = this->PropertyName.c_str();
  const char *value = this->PropertyValue.c_str();
  if (this->Remove)
    {
    value = 0;
    }

  if(this->AppendMode)
    {
    sf->AppendProperty(name, value, this->AppendAsString);
    }
  else
    {
    sf->SetProperty(name, value);
    }
  return true;
}